

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

void FFSMarshalInstallMetadata(SstStream Stream,TSMetadataMsg MetaData)

{
  SstData p_Var1;
  ulong uVar2;
  FFSMetadataInfoStruct *pFVar3;
  TSMetadataMsg p_Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 *puVar8;
  void *pvVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  long *__ptr;
  size_t sVar15;
  FFSVarRec_conflict pFVar16;
  char *pcVar17;
  ulong uVar18;
  undefined *puVar19;
  uint uVar20;
  size_t sVar21;
  ulong *puVar22;
  ulong uVar23;
  long lVar24;
  long *plVar25;
  long *plVar26;
  int ElementSize;
  int Type;
  FFSMetadataInfoStruct *local_60;
  int local_54;
  int local_50;
  int local_4c;
  void *local_48;
  undefined8 *local_40;
  TSMetadataMsg local_38;
  
  FFSMarshalInstallPreciousMetadata(Stream,MetaData);
  uVar18 = (ulong)(uint)Stream->WriterCohortSize;
  if (0 < Stream->WriterCohortSize) {
    lVar24 = 0;
    local_38 = MetaData;
    do {
      p_Var4 = local_38;
      puVar8 = (undefined8 *)Stream->ReaderMarshalData;
      if (puVar8 == (undefined8 *)0x0) {
        puVar8 = (undefined8 *)malloc(0x50);
        *puVar8 = 0;
        puVar8[1] = 0;
        puVar8[2] = 0;
        puVar8[3] = 0;
        puVar8[4] = 0;
        puVar8[5] = 0;
        puVar8[6] = 0;
        puVar8[7] = 0;
        puVar8[8] = 0;
        puVar8[9] = 0;
        Stream->ReaderMarshalData = puVar8;
        sVar21 = (size_t)(int)uVar18;
        pvVar9 = calloc(0x18,sVar21);
        puVar8[8] = pvVar9;
        pvVar9 = calloc(8,sVar21);
        puVar8[4] = pvVar9;
        pvVar9 = calloc(8,sVar21);
        puVar8[5] = pvVar9;
        pvVar9 = calloc(8,sVar21);
        puVar8[6] = pvVar9;
        pvVar9 = calloc(8,sVar21);
        puVar8[7] = pvVar9;
      }
      if (p_Var4->Metadata[lVar24].block == (char *)0x0) {
        fprintf(_stderr,
                "FAILURE!   MetaData->Metadata[WriterRank]->block == NULL for WriterRank = %d\n",
                lVar24);
      }
      uVar10 = FFSTypeHandle_from_encode(Stream->ReaderFFSContext,p_Var4->Metadata[lVar24].block);
      iVar5 = FFShas_conversion(uVar10);
      if (iVar5 == 0) {
        uVar11 = FMContext_from_FFS(Stream->ReaderFFSContext);
        uVar11 = FMformat_from_ID(uVar11,p_Var4->Metadata[lVar24].block);
        uVar11 = format_list_of_FMFormat(uVar11);
        uVar11 = FMcopy_struct_list(uVar11);
        FMlocalize_structs(uVar11);
        establish_conversion(Stream->ReaderFFSContext,uVar10,uVar11);
        FMfree_struct_list(uVar11);
      }
      iVar5 = FFSdecode_in_place_possible(uVar10);
      p_Var1 = p_Var4->Metadata;
      if (iVar5 == 0) {
        sVar21 = FFS_est_decode_length
                           (Stream->ReaderFFSContext,p_Var1[lVar24].block,p_Var1[lVar24].DataSize);
        local_60 = (FFSMetadataInfoStruct *)malloc(sVar21);
        FFSdecode_to_buffer(Stream->ReaderFFSContext,p_Var4->Metadata[lVar24].block,local_60);
      }
      else {
        FFSdecode_in_place(Stream->ReaderFFSContext,p_Var1[lVar24].block,&local_60);
      }
      if (BuildVarList_DumpMetadata == 0xffffffff) {
        pcVar12 = getenv("SstDumpMetadata");
        BuildVarList_DumpMetadata = (uint)(pcVar12 != (char *)0x0);
      }
      if ((BuildVarList_DumpMetadata != 0) && (Stream->Rank == 0)) {
        printf("\nIncomingMetadatablock from WriterRank %d is %p :\n",lVar24,local_60);
        uVar11 = FMFormat_of_original(uVar10);
        FMdump_data(uVar11,local_60,0xfa000);
        puts("\n");
      }
      lVar13 = FMFormat_of_original(uVar10);
      __ptr = *(long **)((long)Stream->ReaderMarshalData + 0x48);
      if (__ptr == (long *)0x0) {
        __ptr = (long *)0x0;
      }
      else {
        do {
          if (*__ptr == lVar13) goto LAB_001179ab;
          __ptr = (long *)__ptr[2];
        } while (__ptr != (long *)0x0);
        __ptr = (long *)0x0;
      }
LAB_001179ab:
      if (__ptr == (long *)0x0) {
        local_40 = puVar8;
        lVar13 = FMFormat_of_original(uVar10);
        local_48 = Stream->ReaderMarshalData;
        lVar14 = format_list_of_FMFormat(lVar13);
        plVar26 = (long *)(*(long *)(lVar14 + 8) + -0x18);
        do {
          pcVar12 = (char *)plVar26[3];
          plVar26 = plVar26 + 3;
          iVar5 = strncmp(pcVar12,"BitField",8);
        } while (iVar5 == 0);
        while ((pcVar12 != (char *)0x0 && (iVar5 = strncmp(pcVar12,"DataBlockSize",8), iVar5 == 0)))
        {
          pcVar12 = (char *)plVar26[3];
          plVar26 = plVar26 + 3;
        }
        __ptr = (long *)malloc(0x38);
        *__ptr = lVar13;
        if (*plVar26 == 0) {
          iVar5 = 0;
        }
        else {
          iVar5 = 0;
          lVar13 = 0x30;
          sVar21 = 0x38;
          iVar6 = 0;
          plVar25 = plVar26;
          do {
            __ptr = (long *)realloc(__ptr,sVar21);
            *(int *)((long)__ptr + lVar13 + -0x18) = iVar6;
            *(undefined4 *)((long)__ptr + lVar13 + -0x14) = *(undefined4 *)((long)plVar25 + 0x14);
            pcVar12 = (char *)*plVar25;
            local_54 = iVar6;
            sVar15 = strlen(pcVar12);
            iVar6 = strcmp("Dims",pcVar12 + (sVar15 - 4));
            if (iVar6 == 0) {
              *(undefined4 *)((long)__ptr + lVar13 + -8) = 1;
              pcVar17 = strchr(pcVar12,0x5f);
              pcVar17 = strchr(pcVar17 + 1,0x5f);
              __isoc99_sscanf(pcVar12,"SST%d_%d_",&local_50,&local_4c);
              iVar7 = local_4c;
              iVar6 = local_50;
              pcVar12 = strdup(pcVar17 + 1);
              sVar15 = strlen(pcVar12);
              pcVar12[sVar15 - 4] = '\0';
              pFVar16 = LookupVarByName(Stream,pcVar12);
              if (pFVar16 == (FFSVarRec_conflict)0x0) {
                pFVar16 = CreateVarRec(Stream,pcVar12);
                pFVar16->Type = iVar7;
                pFVar16->ElementSize = iVar6;
                *(int *)((long)__ptr + lVar13) = iVar6;
              }
              iVar6 = local_54 + 5;
              free(pcVar12);
              *(FFSVarRec_conflict *)((long)__ptr + lVar13 + -0x10) = pFVar16;
            }
            else {
              pcVar12 = strdup(pcVar12 + 4);
              *(undefined4 *)((long)__ptr + lVar13 + -8) = 0;
              pFVar16 = LookupVarByName(Stream,pcVar12);
              if (pFVar16 == (FFSVarRec_conflict)0x0) {
                pcVar17 = (char *)plVar25[1];
                iVar6 = (int)plVar25[2];
                iVar7 = strcmp(pcVar17,"integer");
                if (iVar7 == 0) {
                  if (7 < iVar6 - 1U) goto LAB_00117c8b;
                  puVar19 = &DAT_00123a30;
LAB_00117c82:
                  iVar6 = *(int *)(puVar19 + (ulong)(iVar6 - 1) * 4);
                }
                else {
                  iVar7 = strcmp(pcVar17,"unsigned integer");
                  if (iVar7 == 0) {
                    if (iVar6 - 1U < 8) {
                      puVar19 = &DAT_00123a50;
                      goto LAB_00117c82;
                    }
LAB_00117c8b:
                    iVar6 = 0;
                  }
                  else {
                    iVar7 = strcmp(pcVar17,"double");
                    if ((iVar7 == 0) || (iVar7 = strcmp(pcVar17,"float"), iVar7 == 0)) {
                      iVar6 = (iVar6 != 4) + 9;
                    }
                    else {
                      iVar6 = strcmp(pcVar17,"complex4");
                      if (iVar6 == 0) {
                        iVar6 = 0xc;
                      }
                      else {
                        iVar6 = strcmp(pcVar17,"complex8");
                        if (iVar6 != 0) goto LAB_00117c8b;
                        iVar6 = 0xd;
                      }
                    }
                  }
                }
                pFVar16 = CreateVarRec(Stream,pcVar12);
                pFVar16->DimCount = 0;
                *(int *)((long)__ptr + lVar13 + -4) = iVar6;
                pFVar16->Type = iVar6;
              }
              lVar14 = plVar25[2];
              pFVar16->ElementSize = (int)lVar14;
              *(int *)((long)__ptr + lVar13) = (int)lVar14;
              *(FFSVarRec_conflict *)((long)__ptr + lVar13 + -0x10) = pFVar16;
              free(pcVar12);
              iVar6 = local_54 + 1;
            }
            plVar25 = plVar26 + (long)iVar6 * 3;
            iVar5 = iVar5 + 1;
            lVar13 = lVar13 + 0x20;
            sVar21 = sVar21 + 0x38;
          } while (*plVar25 != 0);
        }
        *(int *)(__ptr + 1) = iVar5;
        __ptr[2] = *(long *)((long)local_48 + 0x48);
        *(long **)((long)local_48 + 0x48) = __ptr;
        puVar8 = local_40;
      }
      *(FFSMetadataInfoStruct **)(puVar8[4] + lVar24 * 8) = local_60;
      if (0 < (int)__ptr[1]) {
        lVar13 = 0;
        do {
          pFVar3 = local_60;
          lVar14 = (long)*(int *)((long)__ptr + lVar13 * 0x20 + 0x1c);
          plVar26 = (long *)__ptr[lVar13 * 4 + 4];
          iVar5 = FFSBitfieldTest(local_60,(int)lVar13);
          if (iVar5 != 0) {
            puVar22 = (ulong *)((long)&pFVar3->BitFieldCount + lVar14);
            if ((int)__ptr[lVar13 * 4 + 5] == 0) {
              if (*plVar26 == 0) {
                pvVar9 = (*Stream->VarSetupUpcall)
                                   (Stream->SetupUpcallReader,(char *)plVar26[1],(int)plVar26[4],
                                    puVar22);
                *plVar26 = (long)pvVar9;
              }
            }
            else {
              uVar18 = *puVar22;
              if ((1 < uVar18) &&
                 (Stream->WriterConfigParams->IsRowMajor != Stream->ConfigParams->IsRowMajor)) {
                if (1 < (int)(uint)uVar18) {
                  uVar2 = puVar22[2];
                  puVar8 = (undefined8 *)(uVar2 + (ulong)((uint)uVar18 & 0x7fffffff) * 8);
                  uVar23 = 0;
                  do {
                    puVar8 = puVar8 + -1;
                    uVar10 = *(undefined8 *)(uVar2 + uVar23 * 8);
                    *(undefined8 *)(uVar2 + uVar23 * 8) = *puVar8;
                    *puVar8 = uVar10;
                    uVar23 = uVar23 + 1;
                  } while (((uint)(uVar18 >> 1) & 0x3fffffff) != uVar23);
                }
                uVar18 = *puVar22;
                uVar20 = (uint)uVar18;
                if (1 < (int)uVar20) {
                  uVar2 = puVar22[3];
                  puVar8 = (undefined8 *)(uVar2 + (ulong)(uVar20 & 0x7fffffff) * 8);
                  uVar23 = 0;
                  do {
                    puVar8 = puVar8 + -1;
                    uVar10 = *(undefined8 *)(uVar2 + uVar23 * 8);
                    *(undefined8 *)(uVar2 + uVar23 * 8) = *puVar8;
                    *puVar8 = uVar10;
                    uVar23 = uVar23 + 1;
                  } while (((uint)(uVar18 >> 1) & 0x3fffffff) != uVar23);
                }
                uVar18 = *puVar22;
                uVar20 = (uint)uVar18;
                if (1 < (int)uVar20) {
                  uVar2 = puVar22[4];
                  puVar8 = (undefined8 *)(uVar2 + (ulong)(uVar20 & 0x7fffffff) * 8);
                  uVar23 = 0;
                  do {
                    puVar8 = puVar8 + -1;
                    uVar10 = *(undefined8 *)(uVar2 + uVar23 * 8);
                    *(undefined8 *)(uVar2 + uVar23 * 8) = *puVar8;
                    *puVar8 = uVar10;
                    uVar23 = uVar23 + 1;
                  } while (((uint)(uVar18 >> 1) & 0x3fffffff) != uVar23);
                }
              }
              if (lVar24 == 0) {
                plVar26[5] = puVar22[2];
              }
              if (*plVar26 == 0) {
                pvVar9 = (*Stream->ArraySetupUpcall)
                                   (Stream->SetupUpcallReader,(char *)plVar26[1],(int)plVar26[4],
                                    (int)*puVar22,(size_t *)puVar22[2],(size_t *)puVar22[4],
                                    (size_t *)puVar22[3]);
                *plVar26 = (long)pvVar9;
              }
              uVar18 = *puVar22;
              plVar26[3] = uVar18;
              if (uVar18 == 0) {
                uVar18 = 1;
              }
              else {
                uVar18 = puVar22[1] / uVar18;
              }
              *(ulong *)(plVar26[7] + lVar24 * 8) = uVar18;
              *(ulong *)(plVar26[8] + lVar24 * 8) = puVar22[4];
              *(ulong *)(plVar26[9] + lVar24 * 8) = puVar22[3];
              if (lVar24 == 0) {
                *(undefined8 *)plVar26[6] = 0;
              }
              if (lVar24 < (long)Stream->WriterCohortSize + -1) {
                *(long *)(plVar26[6] + 8 + lVar24 * 8) =
                     *(long *)(plVar26[7] + lVar24 * 8) + *(long *)(plVar26[6] + lVar24 * 8);
              }
            }
            *(long *)(plVar26[2] + lVar24 * 8) = lVar14;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < (int)__ptr[1]);
      }
      lVar24 = lVar24 + 1;
      uVar18 = (ulong)Stream->WriterCohortSize;
    } while (lVar24 < (long)uVar18);
  }
  return;
}

Assistant:

extern void FFSMarshalInstallMetadata(SstStream Stream, TSMetadataMsg MetaData)
{
    FFSMarshalInstallPreciousMetadata(Stream, MetaData);

    for (int i = 0; i < Stream->WriterCohortSize; i++)
    {
        BuildVarList(Stream, MetaData, i);
    }
}